

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O2

void __thiscall Spc_Dsp::load(Spc_Dsp *this,uint8_t *regs)

{
  voice_t *pvVar1;
  long lVar2;
  
  memcpy(this,regs,0x80);
  memset((this->m).echo_hist,0,0x638);
  pvVar1 = (this->m).voices + 7;
  for (lVar2 = -8; lVar2 != 0; lVar2 = lVar2 + 1) {
    pvVar1->brr_offset = 1;
    pvVar1->buf_pos = pvVar1->buf;
    pvVar1 = pvVar1 + -1;
  }
  (this->m).new_kon = (uint)(this->m).regs[0x4c];
  mute_voices(this,(this->m).mute_mask);
  soft_reset_common(this);
  return;
}

Assistant:

void Spc_Dsp::load( uint8_t const regs [register_count] )
{
	memcpy( m.regs, regs, sizeof m.regs );
	memset( &m.regs [register_count], 0, offsetof (state_t,ram) - register_count );
	
	// Internal state
	int i;
	for ( i = voice_count; --i >= 0; )
	{
		voice_t& v = m.voices [i];
		v.brr_offset = 1;
		v.buf_pos    = v.buf;
	}
	m.new_kon = REG(kon);
	
	mute_voices( m.mute_mask );
	soft_reset_common();
}